

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20HM303D.cpp
# Opt level: O2

bool __thiscall RTIMUGD20HM303D::setAccelCTRL2(RTIMUGD20HM303D *this)

{
  uint uVar1;
  uint uVar2;
  RTIMUSettings *this_00;
  bool bVar3;
  char *__format;
  
  this_00 = (this->super_RTIMU).m_settings;
  uVar1 = this_00->m_GD20HM303DAccelLpf;
  if (uVar1 < 4) {
    uVar2 = this_00->m_GD20HM303DAccelFsr;
    if ((ulong)uVar2 < 5) {
      this->m_accelScale = *(RTFLOAT *)(&DAT_0012033c + (ulong)uVar2 * 4);
      bVar3 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,this->m_accelCompassSlaveAddr,'!',
                                 (char)uVar1 * '@' + (char)uVar2 * '\b',
                                 "Failed to set LSM303D CTRL2");
      return bVar3;
    }
    __format = "Illegal LSM303D accel FSR code %d\n";
    uVar1 = uVar2;
  }
  else {
    __format = "Illegal LSM303D accel low pass fiter code %d\n";
  }
  fprintf(_stderr,__format,(ulong)uVar1);
  return false;
}

Assistant:

bool RTIMUGD20HM303D::setAccelCTRL2()
{
    unsigned char ctrl2;

    if ((m_settings->m_GD20HM303DAccelLpf < 0) || (m_settings->m_GD20HM303DAccelLpf > 3)) {
        HAL_ERROR1("Illegal LSM303D accel low pass fiter code %d\n", m_settings->m_GD20HM303DAccelLpf);
        return false;
    }

    switch (m_settings->m_GD20HM303DAccelFsr) {
    case LSM303D_ACCEL_FSR_2:
        m_accelScale = (RTFLOAT)0.000061;
        break;

    case LSM303D_ACCEL_FSR_4:
        m_accelScale = (RTFLOAT)0.000122;
        break;

    case LSM303D_ACCEL_FSR_6:
        m_accelScale = (RTFLOAT)0.000183;
        break;

    case LSM303D_ACCEL_FSR_8:
        m_accelScale = (RTFLOAT)0.000244;
        break;

    case LSM303D_ACCEL_FSR_16:
        m_accelScale = (RTFLOAT)0.000732;
        break;

    default:
        HAL_ERROR1("Illegal LSM303D accel FSR code %d\n", m_settings->m_GD20HM303DAccelFsr);
        return false;
    }

    ctrl2 = (m_settings->m_GD20HM303DAccelLpf << 6) | (m_settings->m_GD20HM303DAccelFsr << 3);

    return m_settings->HALWrite(m_accelCompassSlaveAddr,  LSM303D_CTRL2, ctrl2, "Failed to set LSM303D CTRL2");
}